

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

void __thiscall
CVmObjTads::reload_from_image(CVmObjTads *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  uint uVar1;
  vm_tadsobj_hdr *pvVar2;
  vm_tadsobj_hdr *pvVar3;
  void *in_RDX;
  undefined4 in_ESI;
  CVmObjTads *in_RDI;
  CVmObjTable *unaff_retaddr;
  vm_tadsobj_hdr *in_stack_00000008;
  ushort sc_cnt;
  vm_tadsobj_hdr *hdr;
  undefined4 in_stack_fffffffffffffff0;
  CVmObjTads *ptr_00;
  
  ptr_00 = in_RDI;
  pvVar2 = get_hdr(in_RDI);
  uVar1 = ::osrp2(in_RDX);
  pvVar2->prop_entry_free = 0;
  memset(pvVar2->hash_arr,0,(ulong)pvVar2->hash_siz << 3);
  if ((uint)pvVar2->sc_cnt < (uVar1 & 0xffff)) {
    pvVar3 = vm_tadsobj_hdr::expand_to
                       ((CVmObjTads *)hdr,in_stack_00000008,(size_t)unaff_retaddr,(size_t)ptr_00);
    (in_RDI->super_CVmObject).ext_ = (char *)pvVar3;
  }
  load_image_props_and_scs
            ((CVmObjTads *)unaff_retaddr,(char *)ptr_00,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  pvVar2->intern_obj_flags = pvVar2->intern_obj_flags & 0xfffd;
  CVmObjTable::request_post_load_init(unaff_retaddr,(vm_obj_id_t)((ulong)ptr_00 >> 0x20));
  return;
}

Assistant:

void CVmObjTads::reload_from_image(VMG_ vm_obj_id_t self,
                                   const char *ptr, size_t siz)
{
    /* get my header */
    vm_tadsobj_hdr *hdr = get_hdr();

    /* get the number of superclasses */
    ushort sc_cnt = osrp2(ptr);

    /* 
     *   Clear the property table.  We don't have to worry about the new
     *   property table being larger than the existing property table,
     *   because we can't have shrunk since we were originally loaded.  So,
     *   all we need to do is mark all property entries as free and clear
     *   out the hash table.  
     */
    hdr->prop_entry_free = 0;
    memset(hdr->hash_arr, 0, hdr->hash_siz * sizeof(hdr->hash_arr[0]));

    /* if we need space for more superclasses, reallocate the header */
    if (sc_cnt > hdr->sc_cnt)
    {
        /* allocate the new header */
        ext_ = (char *)vm_tadsobj_hdr::expand_to(
            vmg_ this, hdr, sc_cnt, hdr->prop_entry_cnt);
    }

    /* reload the image properties and superclasses */
    load_image_props_and_scs(vmg_ ptr, siz);

    /* we're now unmodified from the image file state */
    hdr->intern_obj_flags &= ~VMTO_OBJ_MOD;

    /* request post-load initialization, to set up the superclass list */
    G_obj_table->request_post_load_init(self);
}